

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

void __thiscall ON_PostEffects::CImpl::EnsurePopulated(CImpl *this)

{
  if (this->_is_populated != false) {
    return;
  }
  this->_is_populated = true;
  Populate(this,Early);
  Populate(this,ToneMapping);
  Populate(this,Late);
  return;
}

Assistant:

void ON_PostEffects::CImpl::EnsurePopulated(void) const
{
  if (_is_populated)
    return;

  _is_populated = true;

  Populate(ON_PostEffect::Types::Early);
  Populate(ON_PostEffect::Types::ToneMapping);
  Populate(ON_PostEffect::Types::Late);
}